

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

BitcastType __thiscall
spirv_cross::CompilerHLSL::get_bitcast_type(CompilerHLSL *this,uint32_t result_type,uint32_t op0)

{
  int iVar1;
  int iVar2;
  BitcastType BVar3;
  SPIRType *pSVar4;
  SPIRType *pSVar5;
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + result_type);
  pSVar5 = Compiler::expression_type((Compiler *)this,op0);
  iVar1 = *(int *)&(pSVar4->super_IVariant).field_0xc;
  iVar2 = *(int *)&(pSVar5->super_IVariant).field_0xc;
  if (((iVar1 != 10) || (iVar2 != 8)) || (BVar3 = TypePackUint2x32, pSVar5->vecsize != 2)) {
    BVar3 = (uint)(iVar2 == 10 && (pSVar4->vecsize == 2 && iVar1 == 8)) * 2;
  }
  return BVar3;
}

Assistant:

CompilerHLSL::BitcastType CompilerHLSL::get_bitcast_type(uint32_t result_type, uint32_t op0)
{
	auto &rslt_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);

	if (rslt_type.basetype == SPIRType::BaseType::UInt64 && expr_type.basetype == SPIRType::BaseType::UInt &&
	    expr_type.vecsize == 2)
		return BitcastType::TypePackUint2x32;
	else if (rslt_type.basetype == SPIRType::BaseType::UInt && rslt_type.vecsize == 2 &&
	         expr_type.basetype == SPIRType::BaseType::UInt64)
		return BitcastType::TypeUnpackUint64;

	return BitcastType::TypeNormal;
}